

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O3

void __thiscall
Volume::calculateVisualSpace
          (Volume *this,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *_obstcs,Vector2d *obs,Mat *src)

{
  long lVar1;
  pointer pvVar2;
  pointer pPVar3;
  Object *pOVar4;
  pointer pEVar5;
  _Map_pointer ppMVar6;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar7;
  _Elt_pointer pMVar8;
  double dVar9;
  double dVar10;
  pointer pvVar11;
  Edge *eg;
  long *plVar12;
  pointer pEVar13;
  Object *projectee;
  array<cv::Point_<int>,_11UL> *paVar14;
  array<cv::Point_<int>,_9UL> *paVar15;
  pointer pts;
  Object *obj_00;
  Object *this_00;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar16;
  int iVar17;
  pointer __args;
  long lVar18;
  Obstacle *obstacle;
  pointer pvVar19;
  long lVar20;
  Object obj;
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  local_b8;
  Vector2d *local_98;
  Mat *local_90;
  Volume *local_88;
  Object local_80;
  Vector2d local_48;
  
  lVar20 = *(long *)(this + 0x20);
  lVar1 = *(long *)(this + 0x28);
  lVar18 = lVar20;
  local_98 = obs;
  local_90 = src;
  if (lVar1 != lVar20) {
    do {
      std::vector<Edge,_std::allocator<Edge>_>::~vector
                ((vector<Edge,_std::allocator<Edge>_> *)(lVar18 + 0x10));
      lVar18 = lVar18 + 0x38;
    } while (lVar18 != lVar1);
    *(long *)(this + 0x28) = lVar20;
  }
  local_b8.
  super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        *)0x0;
  local_b8.
  super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        *)0x0;
  local_b8.
  super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        *)0x0;
  pvVar19 = (_obstcs->
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (_obstcs->
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar19 != pvVar2) {
    do {
      if (local_b8.
          super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_b8.
          super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
        ::_M_realloc_insert<>
                  (&local_b8,
                   (iterator)
                   local_b8.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        ((local_b8.
          super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((local_b8.
          super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((local_b8.
          super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8.
        super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pPVar3 = (pvVar19->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (__args = (pvVar19->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; __args != pPVar3;
          __args = __args + 1) {
        std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
        ::emplace_back<int_const&,int_const&>
                  ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                    *)(local_b8.
                       super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1),&__args->x,&__args->y);
      }
      pvVar19 = pvVar19 + 1;
    } while (pvVar19 != pvVar2);
    if (local_b8.
        super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_b8.
        super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ((local_b8.
        super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((local_b8.
        super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_b8.
        super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_b8.
           super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
      goto LAB_0010be5e;
    }
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::_M_realloc_insert<>
            (&local_b8,
             (iterator)
             local_b8.
             super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
LAB_0010be5e:
  local_88 = this + 0x20;
  lVar20 = 0x58;
  paVar14 = &north_wall;
  do {
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                *)(local_b8.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1),(int *)paVar14,
               &paVar14->_M_elems[0].y);
    paVar14 = (array<cv::Point_<int>,_11UL> *)((long)paVar14 + 8);
    lVar20 = lVar20 + -8;
  } while (lVar20 != 0);
  if (local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::_M_realloc_insert<>
              (&local_b8,
               (iterator)
               local_b8.
               super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  lVar20 = 0x48;
  paVar15 = &east_wall;
  do {
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                *)(local_b8.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1),(int *)paVar15,
               &paVar15->_M_elems[0].y);
    paVar15 = (array<cv::Point_<int>,_9UL> *)((long)paVar15 + 8);
    lVar20 = lVar20 + -8;
  } while (lVar20 != 0);
  if (local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::_M_realloc_insert<>
              (&local_b8,
               (iterator)
               local_b8.
               super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  lVar20 = 0x58;
  paVar14 = &south_wall;
  do {
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                *)(local_b8.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1),(int *)paVar14,
               &paVar14->_M_elems[0].y);
    paVar14 = (array<cv::Point_<int>,_11UL> *)((long)paVar14 + 8);
    lVar20 = lVar20 + -8;
  } while (lVar20 != 0);
  if (local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::_M_realloc_insert<>
              (&local_b8,
               (iterator)
               local_b8.
               super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  lVar20 = 0x48;
  paVar15 = &west_wall;
  do {
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                *)(local_b8.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1),(int *)paVar15,
               &paVar15->_M_elems[0].y);
    pvVar11 = local_b8.
              super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    paVar15 = (array<cv::Point_<int>,_9UL> *)((long)paVar15 + 8);
    lVar20 = lVar20 + -8;
  } while (lVar20 != 0);
  if (local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar17 = 0;
    pts = local_b8.
          super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_80.id = iVar17;
      local_80.edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_80.angle_range.first = 0.0;
      local_80.edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_80.edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_80.angle_range.second = 0.0;
      local_80.min_dist = 1000000000.0;
      Object::intialize(&local_80,pts,local_98);
      std::vector<Object,_std::allocator<Object>_>::push_back
                ((vector<Object,_std::allocator<Object>_> *)local_88,&local_80);
      iVar17 = iVar17 + 1;
      std::vector<Edge,_std::allocator<Edge>_>::~vector(&local_80.edges);
      pts = pts + 1;
    } while (pts != pvVar11);
  }
  local_80.id = 0;
  local_80.valid = false;
  local_80._5_3_ = 0;
  if (*(long *)(this + 0x28) != *(long *)(this + 0x20)) {
    do {
      std::
      priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,Volume::ObjCompFunctor>
      ::emplace<unsigned_long&>
                ((priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,Volume::ObjCompFunctor>
                  *)this,(unsigned_long *)&local_80);
      local_80._0_8_ = local_80._0_8_ + 1;
    } while ((ulong)local_80._0_8_ <
             (ulong)((*(long *)(this + 0x28) - *(long *)(this + 0x20) >> 3) * 0x6db6db6db6db6db7));
  }
  plVar12 = *(long **)this;
  if (plVar12 != *(long **)(this + 8)) {
    do {
      this_00 = (Object *)(*plVar12 * 0x38 + *(long *)(this + 0x20));
      std::
      priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
      ::pop((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
             *)this);
      Object::internalProjection(this_00,local_98);
      pOVar4 = *(Object **)(this + 0x28);
      for (obj_00 = *(Object **)(this + 0x20); obj_00 != pOVar4; obj_00 = obj_00 + 1) {
        if ((obj_00->valid != false) && (this_00->id != obj_00->id)) {
          local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
          array[0] = (local_98->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                     m_storage.m_data.array[0];
          local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
          array[1] = (local_98->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                     m_storage.m_data.array[1];
          Object::externalOcclusion(this_00,obj_00,&local_48);
          pEVar5 = (obj_00->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pEVar13 = (obj_00->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                         super__Vector_impl_data._M_start; pEVar13 != pEVar5; pEVar13 = pEVar13 + 1)
          {
            if (pEVar13->valid != false) {
              ppMVar6 = (pEVar13->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ).
                        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node;
              pMVar16 = (pEVar13->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ).
                        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              pMVar7 = (pEVar13->
                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ).
                       super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first;
              pMVar8 = (pEVar13->
                       super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ).
                       super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              if (((long)(pEVar13->
                         super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ).
                         super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pMVar8 >> 3) *
                  -0x5555555555555555 + ((long)pMVar16 - (long)pMVar7 >> 3) * -0x5555555555555555 +
                  (((long)ppMVar6 -
                    (long)(pEVar13->
                          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ).
                          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                  (ulong)(ppMVar6 == (_Map_pointer)0x0)) * 0x15 < 3) {
                if (pMVar16 == pMVar7) {
                  pMVar16 = ppMVar6[-1] + 0x15;
                }
                dVar9 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[0] -
                        pMVar16[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0];
                dVar10 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data.array[1] -
                         pMVar16[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1];
                if (SQRT(dVar10 * dVar10 + dVar9 * dVar9) < 1.0) {
                  pEVar13->valid = false;
                }
              }
            }
          }
        }
      }
      local_80._0_8_ =
           CONCAT44((int)(local_98->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                         m_storage.m_data.array[1],
                    (int)(local_98->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
                         m_storage.m_data.array[0]);
      simplePreVisualize(this,local_90,(Point *)&local_80);
      plVar12 = *(long **)this;
    } while (plVar12 != *(long **)(this + 8));
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void Volume::calculateVisualSpace(const std::vector<Obstacle>& _obstcs, Eigen::Vector2d obs, cv::Mat& src) {
    objs.clear();
    std::vector<std::vector<Eigen::Vector2d>> obstcs;
    for (const Obstacle& obstacle: _obstcs) {            // 构建objects
        obstcs.emplace_back();
        for (const cv::Point& pt: obstacle)
            obstcs.back().emplace_back(pt.x, pt.y);
    }
    // ================ add walls ================
    obstcs.emplace_back();
    for (const cv::Point& pt: north_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: east_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: south_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: west_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 

    int obj_cnt = 0;
    for (const std::vector<Eigen::Vector2d>& obstacle: obstcs) {            // 构建objects
        Object obj(obj_cnt);
        obj.intialize(obstacle, obs);
        objs.push_back(obj);
        obj_cnt++;
    }
    for (size_t i = 0; i < objs.size(); i++)            // 构建堆
        heap.emplace(i);
    while (heap.empty() == false) {
        size_t obj_id = heap.top();
        Object& obj = objs[obj_id];
        heap.pop();
        LOG_ERROR("Object %d, started to internal project.", obj_id);
        obj.internalProjection(obs);
        LOG_MARK("After interal proj, valids in object %d are:", obj_id);
        LOG_MARK("Object %d, started to external project.", obj_id);
        for (Object& projectee: objs) {
            // 不查看完全被遮挡的，不投影已经投影过的
            if (projectee.valid == false || obj.id == projectee.id) continue;
            LOG_GAY("External occ, object %lu", projectee.id);
            obj.externalOcclusion(projectee, obs);
            LOG_CHECK("Projectee (%d) processed, edges (valid):", projectee.id);
            for (Edge& eg: projectee.edges) {
                if (eg.valid == false || eg.size() > 2) continue;
                Eigen::Vector2d diff = eg.front().block<2, 1>(0, 0) - eg.back().block<2, 1>(0, 0);
                if (diff.norm() < 1.0) {
                    LOG_ERROR("Projectee %d has one singular edge, (%.4lf, %.4lf), (%.4lf, %.4lf)", projectee.id, eg.front().x(), eg.front().y(), eg.back().x(), eg.back().y());
                    eg.valid = false;
                }
            }
        }
        LOG_SHELL("After external proj, valids in object %d are:", obj_id);
        simplePreVisualize(src, cv::Point(obs.x(), obs.y()));
    }
}